

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Point_List_Data *in_data)

{
  uint *puVar1;
  Am_Point_List_Data *pAVar2;
  
  pAVar2 = this->data;
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  this->data = in_data;
  this->item = (Am_Point_Item *)0x0;
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(Am_Point_List_Data *in_data)
{
  if (data)
    data->Release();
  data = in_data;
  item = nullptr;
  return *this;
}